

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

uint __thiscall UnionType::indexOfType(UnionType *this,Type *type)

{
  pointer ppVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  raw_ostream *this_00;
  ulong uVar5;
  ulong local_38 [4];
  
  ppVar1 = (this->super_AggregateType).items.
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->super_AggregateType).items.
                super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar2 != 0) {
    uVar5 = (lVar2 >> 3) * -0x3333333333333333;
    uVar3 = 0;
    do {
      if (ppVar1[uVar3].first == type) {
        return (uint)uVar3;
      }
      uVar3 = (ulong)((uint)uVar3 + 1);
    } while (uVar3 <= uVar5 && uVar5 - uVar3 != 0);
  }
  pcVar4 = (char *)llvm::errs();
  (*type->_vptr_Type[3])(local_38,type);
  this_00 = (raw_ostream *)llvm::raw_ostream::write(pcVar4,local_38[0]);
  llvm::raw_ostream::operator<<(this_00,"\n");
  std::__cxx11::string::~string((string *)local_38);
  abort();
}

Assistant:

unsigned UnionType::indexOfType(Type* type) const {
    for (unsigned i = 0; i < items.size(); ++i) {
        if (items[i].first == type) {
            return i;
        }
    }

    llvm::errs() << type->toString() << "\n";
    assert(false && "UnionType::indexOfType: type not found in the union");
    abort();
}